

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

Vec_Int_t * Tim_ManAlignTwo(Tim_Man_t *pSpec,Tim_Man_t *pImpl)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  
  pVVar1 = pSpec->vBoxes;
  iVar4 = 0;
  iVar3 = 0;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar1->nSize;
  }
  if (pImpl->vBoxes != (Vec_Ptr_t *)0x0) {
    iVar4 = pImpl->vBoxes->nSize;
  }
  if (iVar4 < iVar3) {
    iVar3 = 0;
    while( true ) {
      if (pImpl->vBoxes->nSize <= iVar3) {
        iVar4 = 0;
        iVar3 = 0;
        if (pVVar1 != (Vec_Ptr_t *)0x0) {
          iVar3 = pVVar1->nSize;
        }
        p = Vec_IntStart(iVar3);
        while( true ) {
          if (pImpl->vBoxes->nSize <= iVar4) {
            return p;
          }
          pvVar2 = Vec_PtrEntry(pImpl->vBoxes,iVar4);
          iVar3 = Vec_IntEntry(p,*(int *)((long)pvVar2 + 0x14));
          if (iVar3 != 0) break;
          iVar3 = *(int *)((long)pvVar2 + 0x14);
          if (((long)iVar3 < 0) || (p->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p->pArray[iVar3] = 1;
          iVar4 = iVar4 + 1;
        }
        __assert_fail("!Vec_IntEntry(vBoxPres, pBox->iCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0x169,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
      }
      pvVar2 = Vec_PtrEntry(pImpl->vBoxes,iVar3);
      if (*(int *)((long)pvVar2 + 0x14) < 0) {
        return (Vec_Int_t *)0x0;
      }
      pVVar1 = pSpec->vBoxes;
      if (pVVar1 == (Vec_Ptr_t *)0x0) break;
      iVar3 = iVar3 + 1;
      if (pVVar1->nSize <= *(int *)((long)pvVar2 + 0x14)) {
        return (Vec_Int_t *)0x0;
      }
    }
    return (Vec_Int_t *)0x0;
  }
  __assert_fail("Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                ,0x160,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
}

Assistant:

Vec_Int_t * Tim_ManAlignTwo( Tim_Man_t * pSpec, Tim_Man_t * pImpl )
{
    Vec_Int_t * vBoxPres;
    Tim_Box_t * pBox;
    int i;
    assert( Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl) );
    // check if boxes of pImpl can be aligned
    Tim_ManForEachBox( pImpl, pBox, i )
        if ( pBox->iCopy < 0 || pBox->iCopy >= Tim_ManBoxNum(pSpec) ) 
            return NULL;
    // map dropped boxes into 1, others into 0
    vBoxPres = Vec_IntStart( Tim_ManBoxNum(pSpec) );
    Tim_ManForEachBox( pImpl, pBox, i )
    {
        assert( !Vec_IntEntry(vBoxPres, pBox->iCopy) );
        Vec_IntWriteEntry( vBoxPres, pBox->iCopy, 1 );
    }
    return vBoxPres;
}